

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::PathIntegrator::Li
          (PathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  PrimitiveHandle *this_00;
  Vector3f *pVVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  pointer pLVar5;
  uintptr_t uVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  short sVar11;
  LightSampleContext LVar12;
  LightSampleContext LVar13;
  LightSampleContext LVar14;
  LightSampleContext LVar15;
  Vector3f wiRender;
  undefined1 auVar16 [16];
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  SamplerHandle *pSVar32;
  int i;
  BxDFFlags BVar33;
  ulong uVar34;
  BSDFSample *pBVar35;
  ulong uVar36;
  BSDF *bsdf_00;
  long lVar37;
  uint uVar38;
  char cVar39;
  pointer pLVar40;
  long lVar41;
  ImageInfiniteLight *this_01;
  ExhaustiveLightSampler *pEVar42;
  DiffuseBxDF *this_02;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this_03;
  HaltonSampler *this_04;
  DebugMLTSampler *this_05;
  ulong uVar43;
  long in_FS_OFFSET;
  bool bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  float fVar52;
  undefined4 extraout_XMM0_Dc;
  SampledSpectrum ret_1;
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  float fVar53;
  undefined1 auVar55 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  float fVar76;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  float fVar77;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  Float FVar54;
  undefined1 auVar78 [56];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd_05;
  undefined1 auVar74 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar75 [64];
  undefined4 uVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar89 [56];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  Float m;
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  undefined1 in_XMM6 [16];
  SampledSpectrum SVar92;
  Vector3f woRender;
  Vector3f woRender_00;
  Float f;
  BSDFSample bs;
  SampledSpectrum ret;
  SampledSpectrum rrBeta;
  SampledSpectrum Le;
  Float invBase;
  BSDF bsdf;
  optional<pbrt::ShapeIntersection> si;
  undefined1 auVar93 [12];
  uint local_478;
  float local_474;
  DispatchSplit<5> local_459;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [16];
  SamplerHandle *local_430;
  PathIntegrator *local_428;
  undefined1 local_41c [4];
  undefined1 local_418 [12];
  float fStack_40c;
  undefined8 local_408;
  float local_400;
  float local_3fc;
  BxDFFlags local_3f8;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_3e8;
  float local_3e0;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  ulong local_3a0;
  undefined1 local_398 [32];
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  TStack_378;
  undefined8 uStack_370;
  float fStack_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  undefined8 uStack_34c;
  undefined8 uStack_344;
  undefined1 local_338 [4];
  float afStack_334 [5];
  ulong local_320;
  float local_314;
  float local_310;
  float local_30c;
  undefined1 local_308 [16];
  VisibleSurface *local_2f8;
  SamplerHandle local_2f0;
  SamplerHandle local_2e8;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_2e0;
  undefined1 local_2d8 [24];
  Tuple3<pbrt::Normal3,_float> local_2c0;
  Tuple3<pbrt::Normal3,_float> local_2b4 [2];
  Interval<float> local_298;
  Interval<float> IStack_290;
  Interval<float> IStack_288;
  undefined8 uStack_280;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  Interval<float> local_268;
  Interval<float> IStack_260;
  Interval<float> IStack_258;
  VisibleSurface *pVStack_250;
  float fStack_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  bool *local_228;
  ScratchBuffer *local_220;
  Interval<float> local_218;
  Interval<float> IStack_210;
  Interval<float> IStack_208;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined1 local_1d8 [16];
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_1c8;
  ulong local_c8;
  Float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  Tuple3<pbrt::Normal3,_float> TStack_78;
  undefined4 uStack_6c;
  undefined1 auStack_68 [48];
  undefined1 auVar94 [28];
  undefined1 auVar48 [64];
  undefined1 auVar46 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 auVar84 [64];
  
  local_218.low = 0.0;
  local_218.high = 0.0;
  IStack_210.low = 0.0;
  IStack_210.high = 0.0;
  IStack_208.low = 0.0;
  IStack_208.high = 0.0;
  uStack_200 = 0;
  uStack_1fc = 0;
  uStack_1f8 = 0;
  uStack_1f4 = 0;
  fStack_1f0 = 0.0;
  fStack_1ec = 0.0;
  fStack_1e8 = 0.0;
  uStack_1e4 = 0;
  uStack_1e0 = 0;
  auVar62 = ZEXT464(0) << 0x40;
  local_a8._0_4_ = 0.0;
  local_a8._4_4_ = 0.0;
  local_a8._8_8_ = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  TStack_78.z = 0.0;
  uStack_6c = 0;
  auStack_68 = (undefined1  [48])0x0;
  local_30c = 0.5;
  local_310 = 0.33333334;
  local_314 = 0.2;
  fStack_3c0 = 1.0;
  local_3c8 = (undefined1  [8])0x3f8000003f800000;
  fStack_3bc = 1.0;
  _local_3b8 = ZEXT816(0);
  local_1d8 = SUB6416(ZEXT464(0x3f800000),0);
  this_00 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  local_228 = &ray->hasDifferentials;
  iVar31 = 0;
  local_320 = 0;
  local_478 = 0;
  local_430 = sampler;
  local_428 = this;
  local_2f8 = visibleSurface;
  local_220 = scratchBuffer;
  TStack_78._0_8_ = local_a8._0_8_;
  do {
    *(long *)(in_FS_OFFSET + -0x2d8) = *(long *)(in_FS_OFFSET + -0x2d8) + 1;
    if (((this_00->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      auVar62 = ZEXT1664(ZEXT816(0) << 0x40);
      local_c8 = 0;
      local_1c8._0_64_ = auVar62;
      local_1c8._64_64_ = auVar62;
      local_1c8._128_64_ = auVar62;
      local_1c8._192_64_ = auVar62;
    }
    else {
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_1c8.__align,this_00,&ray->super_Ray,
                 INFINITY);
    }
    if ((char)local_c8 == '\0') {
      pLVar40 = (this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                infiniteLights.
                super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                super__Vector_impl_data._M_start;
      pLVar5 = *(pointer *)
                ((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                        infiniteLights.
                        super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                        _M_impl.super__Vector_impl_data + 8);
      sampler = (SamplerHandle *)CONCAT71((int7)((ulong)sampler >> 8),1);
      local_3d8._0_4_ = (int)sampler;
      if (pLVar40 != pLVar5) {
        local_308._0_4_ = local_474 * local_474;
        do {
          auVar75._16_48_ = auVar62._16_48_;
          uVar36 = (pLVar40->
                   super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                   ).bits;
          auVar45 = ZEXT816(0) << 0x40;
          auVar47 = ZEXT816(0) << 0x40;
          if (0x6ffffffffffff < uVar36) {
            sampler = (SamplerHandle *)0xffffffffffff;
            this_01 = (ImageInfiniteLight *)(uVar36 & 0xffffffffffff);
            if (uVar36 >> 0x30 == 8) {
              auVar78 = ZEXT856(0);
              auVar89 = ZEXT856(0);
              SVar92 = ImageInfiniteLight::Le(this_01,&ray->super_Ray,lambda);
              auVar86._0_8_ = SVar92.values.values._8_8_;
              auVar86._8_56_ = auVar89;
              auVar47 = auVar86._0_16_;
              auVar91._0_8_ = SVar92.values.values._0_8_;
              auVar91._8_56_ = auVar78;
              auVar45 = auVar91._0_16_;
            }
            else if ((short)(uVar36 >> 0x30) == 7) {
              auVar78 = ZEXT856(0);
              auVar89 = ZEXT856(0);
              SVar92 = UniformInfiniteLight::Le
                                 ((UniformInfiniteLight *)this_01,&ray->super_Ray,lambda);
              auVar85._0_8_ = SVar92.values.values._8_8_;
              auVar85._8_56_ = auVar89;
              auVar47 = auVar85._0_16_;
              auVar64._0_8_ = SVar92.values.values._0_8_;
              auVar64._8_56_ = auVar78;
              auVar45 = auVar64._0_16_;
            }
            else {
              auVar78 = ZEXT856(0);
              auVar89 = ZEXT856(0);
              SVar92 = PortalImageInfiniteLight::Le
                                 ((PortalImageInfiniteLight *)this_01,&ray->super_Ray,lambda);
              auVar87._0_8_ = SVar92.values.values._8_8_;
              auVar87._8_56_ = auVar89;
              auVar47 = auVar87._0_16_;
              auVar65._0_8_ = SVar92.values.values._0_8_;
              auVar65._8_56_ = auVar78;
              auVar45 = auVar65._0_16_;
            }
          }
          auVar45 = vmovlhps_avx(auVar45,auVar47);
          if (iVar31 == 0 || local_478 != 0) {
            auVar47._0_4_ = auVar45._0_4_ * (float)local_3c8._0_4_;
            auVar47._4_4_ = auVar45._4_4_ * (float)local_3c8._4_4_;
            auVar47._8_4_ = auVar45._8_4_ * fStack_3c0;
            auVar47._12_4_ = auVar45._12_4_ * fStack_3bc;
          }
          else {
            local_2d8._16_4_ = IStack_208.low;
            local_2d8._20_4_ = IStack_208.high;
            local_2d8._0_4_ = local_218.low;
            local_2d8._4_4_ = local_218.high;
            local_2d8._8_4_ = IStack_210.low;
            local_2d8._12_4_ = IStack_210.high;
            local_2c0.z = fStack_1e8;
            local_2c0.y = fStack_1ec;
            local_2c0.x = fStack_1f0;
            local_2b4[0].z = TStack_78.z;
            local_2b4[0].x = TStack_78.x;
            local_2b4[0].y = TStack_78.y;
            uVar6 = (pLVar40->
                    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                    ).bits;
            uVar36 = (local_428->lightSampler).
                     super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                     .bits;
            pEVar42 = (ExhaustiveLightSampler *)(uVar36 & 0xffffffffffff);
            sVar11 = (short)(uVar36 >> 0x30);
            local_398._0_4_ = (undefined4)uVar6;
            local_398._4_4_ = (undefined4)(uVar6 >> 0x20);
            _local_458 = auVar45;
            if (uVar36 < 0x3000000000000) {
              if (sVar11 == 2) {
                local_448._0_4_ =
                     PowerLightSampler::PDF
                               ((PowerLightSampler *)pEVar42,(LightSampleContext *)local_2d8,
                                (LightHandle *)local_398);
                local_448._4_4_ = extraout_XMM0_Db;
                local_448._8_4_ = extraout_XMM0_Dc;
                local_448._12_4_ = extraout_XMM0_Dd;
              }
              else {
                sVar7 = (pEVar42->lights).nStored;
                auVar45 = vcvtusi2ss_avx512f(in_XMM6,sVar7);
                fVar52 = 1.0 / auVar45._0_4_;
                auVar49._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar49._0_4_ = fVar52;
                auVar49._16_48_ = auVar75._16_48_;
                auVar48._4_60_ = auVar49._4_60_;
                auVar48._0_4_ = (uint)(sVar7 != 0) * (int)fVar52;
                local_448 = auVar48._0_16_;
              }
            }
            else if (sVar11 == 3) {
              local_448._0_4_ =
                   BVHLightSampler::PDF
                             ((BVHLightSampler *)pEVar42,(LightSampleContext *)local_2d8,
                              (LightHandle *)local_398);
              local_448._4_4_ = extraout_XMM0_Db_00;
              local_448._8_4_ = extraout_XMM0_Dc_00;
              local_448._12_4_ = extraout_XMM0_Dd_00;
            }
            else {
              local_448._0_4_ =
                   ExhaustiveLightSampler::PDF
                             (pEVar42,(LightSampleContext *)local_2d8,(LightHandle *)local_398);
              local_448._4_4_ = extraout_XMM0_Db_01;
              local_448._8_4_ = extraout_XMM0_Dc_01;
              local_448._12_4_ = extraout_XMM0_Dd_01;
            }
            IStack_258 = IStack_208;
            local_268 = local_218;
            IStack_260 = IStack_210;
            fStack_248 = fStack_1e8;
            sampler = (SamplerHandle *)CONCAT44(fStack_1ec,fStack_1f0);
            fStack_23c = TStack_78.z;
            fStack_244 = TStack_78.x;
            fStack_240 = TStack_78.y;
            pVVar1 = &(ray->super_Ray).d;
            auVar45._8_4_ = fStack_1e8;
            auVar45._0_8_ = sampler;
            auVar45._12_4_ = fStack_244;
            uStack_370._4_4_ = TStack_78.z;
            uStack_370._0_4_ = fStack_240;
            local_398._0_4_ = local_218.low;
            local_398._4_4_ = local_218.high;
            local_398._8_4_ = IStack_210.low;
            local_398._12_4_ = IStack_210.high;
            local_398._16_4_ = IStack_208.low;
            local_398._20_4_ = IStack_208.high;
            local_398._24_4_ = fStack_1f0;
            local_398._28_4_ = fStack_1ec;
            TStack_378.bits = auVar45._8_8_;
            _local_338 = (undefined1  [12])pVVar1->super_Tuple3<pbrt::Vector3,_float>;
            local_3a0 = local_3a0 & 0xffffffff00000000;
            stack0xfffffffffffffbf0 = local_338;
            local_418._0_8_ = local_398;
            local_408 = &local_3a0;
            uVar36 = (pLVar40->
                     super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                     ).bits;
            uVar38 = (uint)(ushort)(uVar36 >> 0x30);
            pVStack_250 = (VisibleSurface *)sampler;
            if (uVar36 < 0x5000000000000) {
              fVar52 = 0.0;
              if (0x2ffffffffffff < uVar36) {
                if (uVar38 == 3) {
                  auVar26._8_8_ = sampler;
                  auVar26._0_4_ = IStack_208.low;
                  auVar26._4_4_ = IStack_208.high;
                  auVar26._16_4_ = fStack_1e8;
                  auVar26._20_4_ = fStack_244;
                  auVar26._24_4_ = fStack_240;
                  auVar26._28_4_ = TStack_78.z;
                  LVar12.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = IStack_210;
                  LVar12.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = local_218;
                  LVar12.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IStack_208;
                  LVar12.n.super_Tuple3<pbrt::Normal3,_float>._0_8_ = sampler;
                  auVar93 = SUB1612(auVar26._16_16_,4);
                  LVar12.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar26._16_16_,0);
                  LVar12.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar93._0_4_;
                  LVar12.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar93._4_4_;
                  LVar12.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar93._8_4_;
                  fVar52 = ProjectionLight::PDF_Li
                                     ((ProjectionLight *)(uVar36 & 0xffffffffffff),LVar12,
                                      (Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
                }
                else {
                  auVar27._8_8_ = sampler;
                  auVar27._0_4_ = IStack_208.low;
                  auVar27._4_4_ = IStack_208.high;
                  auVar27._16_4_ = fStack_1e8;
                  auVar27._20_4_ = fStack_244;
                  auVar27._24_4_ = fStack_240;
                  auVar27._28_4_ = TStack_78.z;
                  LVar13.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = IStack_210;
                  LVar13.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = local_218;
                  LVar13.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IStack_208;
                  LVar13.n.super_Tuple3<pbrt::Normal3,_float>._0_8_ = sampler;
                  auVar93 = SUB1612(auVar27._16_16_,4);
                  LVar13.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar27._16_16_,0);
                  LVar13.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar93._0_4_;
                  LVar13.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar93._4_4_;
                  LVar13.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar93._8_4_;
                  fVar52 = GoniometricLight::PDF_Li
                                     ((GoniometricLight *)(uVar36 & 0xffffffffffff),LVar13,
                                      (Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
                }
              }
            }
            else {
              local_3e8.bits = uVar36;
              fVar52 = detail::DispatchSplit<5>::operator()
                                 ((DispatchSplit<5> *)local_41c,&local_3e8,uVar38 - 4);
            }
            auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar52 * (float)local_448._0_4_ *
                                                    fVar52 * (float)local_448._0_4_)),
                                      ZEXT416((uint)local_474),ZEXT416((uint)local_474));
            fVar52 = (float)local_308._0_4_ / auVar45._0_4_;
            auVar47._0_4_ = fVar52 * (float)local_3c8._0_4_ * (float)local_458._0_4_;
            auVar47._4_4_ = fVar52 * (float)local_3c8._4_4_ * (float)local_458._4_4_;
            auVar47._8_4_ = fVar52 * fStack_3c0 * fStack_450;
            auVar47._12_4_ = fVar52 * fStack_3bc * fStack_44c;
          }
          auVar45 = *(undefined1 (*) [16])(lambda->pdf).values;
          uVar36 = vcmpps_avx512vl(auVar45,_DAT_004b8010,4);
          auVar45 = vdivps_avx512vl(auVar47,auVar45);
          fVar52 = (float)((uint)((byte)uVar36 & 1) * auVar45._0_4_);
          fVar76 = (float)((uint)((byte)(uVar36 >> 1) & 1) * auVar45._4_4_);
          auVar62._4_4_ = fVar76;
          auVar62._0_4_ = fVar52;
          fVar77 = (float)((uint)((byte)(uVar36 >> 2) & 1) * auVar45._8_4_);
          auVar62._8_4_ = fVar77;
          fVar53 = (float)((uint)((byte)(uVar36 >> 3) & 1) * auVar45._12_4_);
          auVar62._12_4_ = fVar53;
          auVar62._16_48_ = auVar75._16_48_;
          local_3b8._0_4_ = fVar52 + (float)local_3b8._0_4_;
          local_3b8._4_4_ = fVar76 + (float)local_3b8._4_4_;
          fStack_3b0 = fVar77 + fStack_3b0;
          fStack_3ac = fVar53 + fStack_3ac;
          pLVar40 = pLVar40 + 1;
          this = local_428;
        } while (pLVar40 != pLVar5);
      }
    }
    else {
      uVar36._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar36._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar55._0_8_ = uVar36 ^ 0x8000000080000000;
      auVar55._8_4_ = 0x80000000;
      auVar55._12_4_ = 0x80000000;
      auVar80._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar80._4_4_ = 0x80000000;
      auVar80._8_4_ = 0x80000000;
      auVar80._12_4_ = 0x80000000;
      uVar3 = vmovlps_avx(auVar55);
      local_398._0_4_ = (undefined4)uVar3;
      local_398._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
      auVar78 = ZEXT856(auVar55._8_8_);
      auVar89 = ZEXT856(auVar80._8_8_);
      local_398._8_4_ = auVar80._0_4_;
      SVar92 = SurfaceInteraction::Le
                         ((SurfaceInteraction *)&local_1c8.__align,(Vector3f *)local_398,lambda);
      auVar91 = local_1c8._192_64_;
      auVar75._16_48_ = auVar62._16_48_;
      auVar84._0_8_ = SVar92.values.values._8_8_;
      auVar84._8_56_ = auVar89;
      uVar36 = auVar89._0_8_;
      auVar63._0_8_ = SVar92.values.values._0_8_;
      auVar63._8_56_ = auVar78;
      _local_338 = vmovlhps_avx(auVar63._0_16_,auVar84._0_16_);
      if (((float)local_338 != 0.0) || (NAN((float)local_338))) {
LAB_003efc51:
        if ((iVar31 == 0) || (local_478 != 0)) {
          fVar52 = (float)local_3c8._0_4_;
          fVar76 = (float)local_3c8._4_4_;
          fVar77 = fStack_3c0;
          fVar53 = fStack_3bc;
        }
        else {
          if ((char)local_c8 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
          }
          uVar3 = local_1c8._200_8_;
          local_2d8._16_4_ = IStack_208.low;
          local_2d8._20_4_ = IStack_208.high;
          local_2d8._0_4_ = local_218.low;
          local_2d8._4_4_ = local_218.high;
          local_2d8._8_4_ = IStack_210.low;
          local_2d8._12_4_ = IStack_210.high;
          local_2c0.z = fStack_1e8;
          local_2c0.y = fStack_1ec;
          local_2c0.x = fStack_1f0;
          local_2b4[0].z = TStack_78.z;
          local_2b4[0].x = TStack_78.x;
          local_2b4[0].y = TStack_78.y;
          uVar36 = (this->lightSampler).
                   super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                   .bits;
          pEVar42 = (ExhaustiveLightSampler *)(uVar36 & 0xffffffffffff);
          sVar11 = (short)(uVar36 >> 0x30);
          local_398._0_4_ = local_1c8._200_4_;
          local_398._4_4_ = local_1c8._204_4_;
          if (uVar36 < 0x3000000000000) {
            if (sVar11 == 2) {
              local_458._0_4_ =
                   PowerLightSampler::PDF
                             ((PowerLightSampler *)pEVar42,(LightSampleContext *)local_2d8,
                              (LightHandle *)local_398);
              local_458._4_4_ = extraout_XMM0_Db_02;
              fStack_450 = (float)extraout_XMM0_Dc_02;
              fStack_44c = (float)extraout_XMM0_Dd_02;
            }
            else {
              sVar7 = (pEVar42->lights).nStored;
              auVar45 = vcvtusi2ss_avx512f(in_XMM6,sVar7);
              fVar52 = 1.0 / auVar45._0_4_;
              auVar75._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar75._0_4_ = fVar52;
              auVar50._4_60_ = auVar75._4_60_;
              auVar50._0_4_ = (uint)(sVar7 != 0) * (int)fVar52;
              _local_458 = auVar50._0_16_;
            }
          }
          else if (sVar11 == 3) {
            local_458._0_4_ =
                 BVHLightSampler::PDF
                           ((BVHLightSampler *)pEVar42,(LightSampleContext *)local_2d8,
                            (LightHandle *)local_398);
            local_458._4_4_ = extraout_XMM0_Db_03;
            fStack_450 = (float)extraout_XMM0_Dc_03;
            fStack_44c = (float)extraout_XMM0_Dd_03;
            this = local_428;
          }
          else {
            local_458._0_4_ =
                 ExhaustiveLightSampler::PDF
                           (pEVar42,(LightSampleContext *)local_2d8,(LightHandle *)local_398);
            local_458._4_4_ = extraout_XMM0_Db_04;
            fStack_450 = (float)extraout_XMM0_Dc_04;
            fStack_44c = (float)extraout_XMM0_Dd_04;
            this = local_428;
          }
          IStack_288 = IStack_208;
          local_298 = local_218;
          IStack_290 = IStack_210;
          fStack_278 = fStack_1e8;
          uStack_280 = CONCAT44(fStack_1ec,fStack_1f0);
          fStack_26c = TStack_78.z;
          fStack_274 = TStack_78.x;
          fStack_270 = TStack_78.y;
          pVVar1 = &(ray->super_Ray).d;
          local_3e8.bits._0_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
          local_3e8.bits._4_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
          local_3e0 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar25._8_4_ = fStack_1e8;
          auVar25._0_8_ = uStack_280;
          auVar25._12_4_ = fStack_274;
          uStack_370._4_4_ = TStack_78.z;
          uStack_370._0_4_ = fStack_270;
          local_398._0_4_ = local_218.low;
          local_398._4_4_ = local_218.high;
          local_398._8_4_ = IStack_210.low;
          local_398._12_4_ = IStack_210.high;
          local_398._16_4_ = IStack_208.low;
          local_398._20_4_ = IStack_208.high;
          local_398._24_4_ = fStack_1f0;
          local_398._28_4_ = fStack_1ec;
          TStack_378.bits = auVar25._8_8_;
          local_41c = (undefined1  [4])0x0;
          stack0xfffffffffffffbf0 = &local_3e8;
          local_418._0_8_ = local_398;
          local_408 = (ulong *)local_41c;
          if ((ulong)uVar3 < 0x5000000000000) {
            fVar52 = 0.0;
            if (0x2ffffffffffff < (ulong)uVar3) {
              if (auVar91._14_2_ == 3) {
                auVar23._8_8_ = uStack_280;
                auVar23._0_4_ = IStack_208.low;
                auVar23._4_4_ = IStack_208.high;
                auVar23._16_4_ = fStack_1e8;
                auVar23._20_4_ = fStack_274;
                auVar23._24_4_ = fStack_270;
                auVar23._28_4_ = TStack_78.z;
                LVar14.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = IStack_210;
                LVar14.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = local_218;
                LVar14.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IStack_208;
                LVar14.n.super_Tuple3<pbrt::Normal3,_float>.x = fStack_1f0;
                LVar14.n.super_Tuple3<pbrt::Normal3,_float>.y = fStack_1ec;
                auVar93 = SUB1612(auVar23._16_16_,4);
                LVar14.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar23._16_16_,0);
                LVar14.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar93._0_4_;
                LVar14.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar93._4_4_;
                LVar14.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar93._8_4_;
                fVar52 = ProjectionLight::PDF_Li
                                   ((ProjectionLight *)(uVar3 & 0xffffffffffff),LVar14,
                                    (Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
              }
              else {
                auVar24._8_8_ = uStack_280;
                auVar24._0_4_ = IStack_208.low;
                auVar24._4_4_ = IStack_208.high;
                auVar24._16_4_ = fStack_1e8;
                auVar24._20_4_ = fStack_274;
                auVar24._24_4_ = fStack_270;
                auVar24._28_4_ = TStack_78.z;
                LVar15.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = IStack_210;
                LVar15.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = local_218;
                LVar15.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IStack_208;
                LVar15.n.super_Tuple3<pbrt::Normal3,_float>.x = fStack_1f0;
                LVar15.n.super_Tuple3<pbrt::Normal3,_float>.y = fStack_1ec;
                auVar93 = SUB1612(auVar24._16_16_,4);
                LVar15.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar24._16_16_,0);
                LVar15.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar93._0_4_;
                LVar15.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar93._4_4_;
                LVar15.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar93._8_4_;
                fVar52 = GoniometricLight::PDF_Li
                                   ((GoniometricLight *)(uVar3 & 0xffffffffffff),LVar15,
                                    (Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
              }
            }
          }
          else {
            local_3a0 = uVar3;
            fVar52 = detail::DispatchSplit<5>::operator()(&local_459,&local_3a0,auVar91._14_2_ - 4);
          }
          auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar52 * (float)local_458._0_4_ *
                                                  fVar52 * (float)local_458._0_4_)),
                                    ZEXT416((uint)local_474),ZEXT416((uint)local_474));
          fVar53 = (local_474 * local_474) / auVar45._0_4_;
          fVar52 = fVar53 * (float)local_3c8._0_4_;
          fVar76 = fVar53 * (float)local_3c8._4_4_;
          fVar77 = fVar53 * fStack_3c0;
          fVar53 = fVar53 * fStack_3bc;
        }
        auVar56._0_4_ = fVar52 * (float)local_338;
        auVar56._4_4_ = fVar76 * afStack_334[0];
        auVar56._8_4_ = fVar77 * afStack_334[1];
        auVar56._12_4_ = fVar53 * afStack_334[2];
        auVar45 = *(undefined1 (*) [16])(lambda->pdf).values;
        uVar36 = vcmpps_avx512vl(auVar45,_DAT_004b8010,4);
        auVar45 = vdivps_avx512vl(auVar56,auVar45);
        fVar53 = (float)((uint)((byte)uVar36 & 1) * auVar45._0_4_);
        fVar77 = (float)((uint)((byte)(uVar36 >> 1) & 1) * auVar45._4_4_);
        auVar46._4_4_ = fVar77;
        auVar46._0_4_ = fVar53;
        fVar76 = (float)((uint)((byte)(uVar36 >> 2) & 1) * auVar45._8_4_);
        auVar46._8_4_ = fVar76;
        fVar52 = (float)((uint)((byte)(uVar36 >> 3) & 1) * auVar45._12_4_);
        auVar46._12_4_ = fVar52;
        uVar43 = auVar46._8_8_;
        auVar62._16_48_ = auVar75._16_48_;
        auVar62._0_16_ = auVar46;
        local_3b8._0_4_ = fVar53 + (float)local_3b8._0_4_;
        local_3b8._4_4_ = fVar77 + (float)local_3b8._4_4_;
        fStack_3b0 = fVar76 + fStack_3b0;
        fStack_3ac = fVar52 + fStack_3ac;
        uVar36 = local_3b8._8_8_;
      }
      else {
        uVar43 = 0;
        while (uVar34 = uVar43, uVar34 != 3) {
          if ((*(float *)(local_338 + uVar34 * 4 + 4) != 0.0) ||
             (uVar43 = uVar34 + 1, NAN(*(float *)(local_338 + uVar34 * 4 + 4)))) break;
        }
        uVar43 = 0;
        if (uVar34 < 3) goto LAB_003efc51;
      }
      if ((char)local_c8 == '\0') {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
      }
      local_2e0.bits =
           (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           .bits;
      local_2e8.
      super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
      .bits = (TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               )(local_430->
                super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                ).bits;
      sampler = (SamplerHandle *)lambda;
      SurfaceInteraction::GetBSDF
                ((BSDF *)local_2d8,(SurfaceInteraction *)&local_1c8.__align,ray,lambda,
                 (CameraHandle *)&local_2e0,local_220,&local_2e8);
      if ((local_2d8._8_8_ & 0xffffffffffff) == 0) {
        if ((char)local_c8 == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
        }
        SurfaceInteraction::SkipIntersection
                  ((SurfaceInteraction *)&local_1c8.__align,ray,(Float)local_1c8._248_4_);
        auVar30._12_4_ = 0;
        auVar30._0_12_ = local_3d8._4_12_;
        local_3d8 = auVar30 << 0x20;
      }
      else {
        sampler = (SamplerHandle *)((ulong)sampler & 0xffffffffffffff00);
        if (iVar31 == 0 && local_2f8 != (VisibleSurface *)0x0) {
          _local_458 = ZEXT816(0);
          uVar43 = 0;
          do {
            uVar43 = uVar43 + 1;
            lVar41 = 0;
            fVar52 = 1.0;
            uVar36 = uVar43;
            do {
              lVar41 = (lVar41 - uVar36 / 2) * 2 + uVar36;
              fVar52 = local_30c * fVar52;
              bVar44 = 1 < uVar36;
              uVar36 = uVar36 / 2;
            } while (bVar44);
            auVar45 = vcvtusi2ss_avx512f(in_XMM6,lVar41);
            lVar41 = 0;
            fVar76 = 1.0;
            uVar36 = uVar43;
            do {
              lVar41 = (lVar41 - uVar36 / 3) * 3 + uVar36;
              fVar76 = local_310 * fVar76;
              bVar44 = 2 < uVar36;
              uVar36 = uVar36 / 3;
            } while (bVar44);
            auVar47 = vcvtusi2ss_avx512f(in_XMM6,lVar41);
            lVar41 = 0;
            fVar77 = 1.0;
            uVar36 = uVar43;
            do {
              lVar41 = (lVar41 - uVar36 / 5) * 5 + uVar36;
              fVar77 = local_314 * fVar77;
              bVar44 = 4 < uVar36;
              uVar36 = uVar36 / 5;
            } while (bVar44);
            auVar55 = vcvtusi2ss_avx512f(in_XMM6,lVar41);
            auVar80 = SUB6416(ZEXT464(0x3f7fffff),0);
            auVar47 = vminss_avx(auVar80,ZEXT416((uint)(fVar76 * auVar47._0_4_)));
            auVar55 = vminss_avx(auVar80,ZEXT416((uint)(fVar77 * auVar55._0_4_)));
            local_418._4_4_ = auVar55._0_4_;
            local_418._0_4_ = auVar47._0_4_;
            if ((char)local_c8 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
            }
            auVar45 = vminss_avx(auVar80,ZEXT416((uint)(fVar52 * auVar45._0_4_)));
            uVar36 = 0;
            BSDF::Sample_f((BSDFSample *)local_398,(BSDF *)local_2d8,(Vector3f)local_1c8._28_12_,
                           auVar45._0_4_,(Point2f *)local_418,Radiance,All);
            if (0.0 < (float)local_398._28_4_) {
              if ((char)local_c8 == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
              }
              auVar45 = vfmadd132ss_fma(ZEXT416((uint)local_1c8._132_4_),
                                        ZEXT416((uint)((float)local_1c8._136_4_ *
                                                      (float)local_398._24_4_)),
                                        ZEXT416((uint)local_398._20_4_));
              auVar47 = vfmsub213ss_fma(ZEXT416((uint)local_398._24_4_),
                                        ZEXT416((uint)local_1c8._136_4_),
                                        ZEXT416((uint)((float)local_1c8._136_4_ *
                                                      (float)local_398._24_4_)));
              auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ + auVar47._0_4_)),
                                        ZEXT416((uint)local_1c8._128_4_),
                                        ZEXT416((uint)local_398._16_4_));
              uVar79 = auVar45._0_4_;
              auVar81._4_4_ = uVar79;
              auVar81._0_4_ = uVar79;
              auVar81._8_4_ = uVar79;
              auVar81._12_4_ = uVar79;
              auVar8._8_4_ = 0x7fffffff;
              auVar8._0_8_ = 0x7fffffff7fffffff;
              auVar8._12_4_ = 0x7fffffff;
              auVar45 = vandps_avx512vl(auVar81,auVar8);
              auVar82._0_4_ = auVar45._0_4_ * (float)local_398._0_4_;
              auVar82._4_4_ = auVar45._4_4_ * (float)local_398._4_4_;
              auVar82._8_4_ = auVar45._8_4_ * (float)local_398._8_4_;
              auVar82._12_4_ = auVar45._12_4_ * (float)local_398._12_4_;
              auVar57._4_4_ = local_398._28_4_;
              auVar57._0_4_ = local_398._28_4_;
              auVar57._8_4_ = local_398._28_4_;
              auVar57._12_4_ = local_398._28_4_;
              auVar45 = vdivps_avx(auVar82,auVar57);
              local_458._0_4_ = auVar45._0_4_ + (float)local_458._0_4_;
              local_458._4_4_ = auVar45._4_4_ + (float)local_458._4_4_;
              fStack_450 = auVar45._8_4_ + fStack_450;
              fStack_44c = auVar45._12_4_ + fStack_44c;
              uVar36 = local_458._8_8_;
            }
          } while (uVar43 != 0x10);
          auVar9._8_4_ = 0x3d800000;
          auVar9._0_8_ = 0x3d8000003d800000;
          auVar9._12_4_ = 0x3d800000;
          _local_418 = (array<float,_4>)vmulps_avx512vl(_local_458,auVar9);
          if ((char)local_c8 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
          }
          VisibleSurface::VisibleSurface
                    ((VisibleSurface *)local_398,(SurfaceInteraction *)&local_1c8.__align,
                     (CameraTransform *)
                     ((this->super_RayIntegrator).super_ImageTileIntegrator.camera.
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      .bits & 0xffffffffffff),(SampledSpectrum *)local_418,lambda);
          (local_2f8->albedo).values.values[3] = fStack_358;
          auVar22._4_4_ = local_398._4_4_;
          auVar22._0_4_ = local_398._0_4_;
          auVar22._8_4_ = local_398._8_4_;
          auVar22._12_4_ = local_398._12_4_;
          uVar17 = local_398._16_4_;
          auVar16 = auVar22;
          auVar94._16_4_ = uVar17;
          auVar94._0_16_ = auVar16;
          uVar18 = local_398._20_4_;
          auVar94._20_4_ = uVar18;
          uVar19 = local_398._24_4_;
          auVar94._24_4_ = uVar19;
          uVar20 = local_398._28_4_;
          auVar62._28_4_ = uVar20;
          auVar62._0_28_ = auVar94;
          uVar21 = TStack_378.bits;
          auVar62._32_8_ = uVar21;
          auVar62[0x28] = uStack_370._0_1_;
          auVar62._41_3_ = uStack_370._1_3_;
          auVar62._44_4_ = uStack_370._4_4_;
          auVar62._48_4_ = fStack_368;
          auVar62._52_4_ = fStack_364;
          auVar62._56_4_ = fStack_360;
          auVar62._60_4_ = fStack_35c;
          uVar43 = auVar22._8_8_;
          local_2f8->set = (bool)(char)local_398._0_4_;
          *(int3 *)&local_2f8->field_0x1 = SUB43(local_398._0_4_,1);
          local_2f8->p = (Point3f)auVar22._4_12_;
          local_2f8->n = (Normal3f)auVar94._16_12_;
          local_2f8->ns = (Normal3f)auVar62._28_12_;
          local_2f8->time = (Float)(int)auVar62._40_8_;
          local_2f8->dzdx = uStack_370._4_4_;
          local_2f8->dzdy = fStack_368;
          (local_2f8->albedo).values.values[0] = fStack_364;
          (local_2f8->albedo).values.values[1] = fStack_360;
          (local_2f8->albedo).values.values[2] = fStack_35c;
          sampler = (SamplerHandle *)local_2f8;
        }
        pBVar35 = (BSDFSample *)(ulong)(iVar31 + 1U);
        local_458._0_4_ = iVar31 + 1U;
        if (iVar31 == this->maxDepth) {
LAB_003f0fb8:
          local_3d8._0_4_ = (int)CONCAT71((int7)((ulong)pBVar35 >> 8),1);
        }
        else {
          if ((this->regularize == true) && ((local_320 & 1) != 0)) {
            *(long *)(in_FS_OFFSET + -0x2c8) = *(long *)(in_FS_OFFSET + -0x2c8) + 1;
            BSDF::Regularize((BSDF *)local_2d8);
          }
          *(long *)(in_FS_OFFSET + -0x2c0) = *(long *)(in_FS_OFFSET + -0x2c0) + 1;
          sVar11 = SUB82(local_2d8._8_8_,6);
          if ((uint)SUB84(local_2d8._8_8_,4) >> 0x11 < 3) {
            if ((ulong)local_2d8._8_8_ < 0x3000000000000) {
              this_02 = (DiffuseBxDF *)(local_2d8._8_8_ & 0xffffffffffff);
              if (sVar11 == 2) {
                BVar33 = DiffuseBxDF::Flags(this_02);
              }
              else {
                fVar52 = (this_02->R).values.values[0];
                uVar43 = 0;
                BVar33 = DiffuseReflection;
                if ((fVar52 == 0.0) && (!NAN(fVar52))) {
                  uVar34 = 0xffffffffffffffff;
                  while (uVar34 != 2) {
                    fVar52 = (this_02->R).values.values[uVar34 + 2];
                    uVar34 = uVar34 + 1;
                    if ((fVar52 != 0.0) || (NAN(fVar52))) goto LAB_003f09a3;
                  }
                  uVar34 = 3;
LAB_003f09a3:
                  uVar43 = 0;
                  BVar33 = (uint)(uVar34 < 3) * 5;
                }
              }
            }
            else {
              this_03 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                        (local_2d8._8_8_ & 0xffffffffffff);
              if (sVar11 == 4) {
                BVar33 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                                   (this_03);
              }
              else if (sVar11 == 3) {
                BVar33 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
                                   ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                     *)this_03);
              }
              else {
                auVar45 = vminss_avx(ZEXT416((uint)(this_03->top).mfDistrib.alpha_y),
                                     ZEXT416((uint)(this_03->top).mfDistrib.alpha_x));
                uVar43 = auVar45._8_8_;
                uVar36 = 0;
                BVar33 = (uint)(auVar45._0_4_ < 0.001) * 8 + (GlossyTransmission|Reflection);
              }
            }
          }
          else if ((ulong)local_2d8._8_8_ >> 0x33 == 0) {
            BVar33 = Unset;
            if (sVar11 == 7) {
              BVar33 = GlossyReflection;
            }
          }
          else if ((ulong)local_2d8._8_8_ >> 0x30 == 8) {
            BVar33 = GlossyReflection;
          }
          else if (sVar11 == 9) {
            auVar45 = vminss_avx(ZEXT416(((uint *)(local_2d8._8_8_ & 0xffffffffffff))[1]),
                                 ZEXT416(*(uint *)(local_2d8._8_8_ & 0xffffffffffff)));
            uVar43 = auVar45._8_8_;
            uVar36 = 0;
            BVar33 = (uint)(auVar45._0_4_ < 0.001) * 8 + GlossyReflection;
          }
          else {
            BVar33 = DiffuseReflection;
          }
          auVar75._16_48_ = auVar62._16_48_;
          if ((BVar33 & (Glossy|Diffuse)) != Unset) {
            *(long *)(in_FS_OFFSET + -0x2b8) = *(long *)(in_FS_OFFSET + -0x2b8) + 1;
            local_2f0.
            super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
            .bits = (TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     )(local_430->
                      super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                      ).bits;
            auVar78 = ZEXT856(uVar43);
            auVar89 = ZEXT856(uVar36);
            SVar92 = SampleLd(this,(SurfaceInteraction *)&local_1c8.__align,(BSDF *)local_2d8,lambda
                              ,&local_2f0);
            auVar88._0_8_ = SVar92.values.values._8_8_;
            auVar88._8_56_ = auVar89;
            auVar66._0_8_ = SVar92.values.values._0_8_;
            auVar66._8_56_ = auVar78;
            auVar45 = vmovlhps_avx(auVar66._0_16_,auVar88._0_16_);
            local_398._0_4_ = auVar45._0_4_;
            local_398._4_4_ = auVar45._4_4_;
            local_398._8_4_ = auVar45._8_4_;
            local_398._12_4_ = auVar45._12_4_;
            if (((float)local_398._0_4_ == 0.0) && (!NAN((float)local_398._0_4_))) {
              uVar36 = 0;
              while (uVar43 = uVar36, uVar43 != 3) {
                if ((*(float *)(local_398 + uVar43 * 4 + 4) != 0.0) ||
                   (uVar36 = uVar43 + 1, NAN(*(float *)(local_398 + uVar43 * 4 + 4)))) break;
              }
              if (2 < uVar43) {
                *(long *)(in_FS_OFFSET + -0x2b0) = *(long *)(in_FS_OFFSET + -0x2b0) + 1;
              }
            }
            auVar58._0_4_ = (float)local_3c8._0_4_ * (float)local_398._0_4_;
            auVar58._4_4_ = (float)local_3c8._4_4_ * (float)local_398._4_4_;
            auVar58._8_4_ = fStack_3c0 * (float)local_398._8_4_;
            auVar58._12_4_ = fStack_3bc * (float)local_398._12_4_;
            auVar45 = *(undefined1 (*) [16])(lambda->pdf).values;
            uVar36 = vcmpps_avx512vl(auVar45,_DAT_004b8010,4);
            auVar45 = vdivps_avx512vl(auVar58,auVar45);
            fVar53 = (float)((uint)((byte)uVar36 & 1) * auVar45._0_4_);
            fVar77 = (float)((uint)((byte)(uVar36 >> 1) & 1) * auVar45._4_4_);
            auVar62._4_4_ = fVar77;
            auVar62._0_4_ = fVar53;
            fVar76 = (float)((uint)((byte)(uVar36 >> 2) & 1) * auVar45._8_4_);
            auVar62._8_4_ = fVar76;
            fVar52 = (float)((uint)((byte)(uVar36 >> 3) & 1) * auVar45._12_4_);
            auVar62._12_4_ = fVar52;
            auVar62._16_48_ = auVar75._16_48_;
            local_3b8._4_4_ = fVar77 + (float)local_3b8._4_4_;
            local_3b8._0_4_ = fVar53 + (float)local_3b8._0_4_;
            fStack_3b0 = fVar76 + fStack_3b0;
            fStack_3ac = fVar52 + fStack_3ac;
          }
          pSVar32 = local_430;
          uVar2 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar4 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          local_448._4_4_ = uVar4;
          local_448._0_4_ = uVar2;
          local_448._8_8_ = 0;
          local_308 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
          uVar36 = (local_430->
                   super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   ).bits;
          local_398._0_4_ = (undefined4)uVar36;
          local_398._4_4_ = (undefined4)(uVar36 >> 0x20);
          FVar54 = detail::DispatchSplit<8>::operator()
                             ((DispatchSplit<8> *)local_418,local_398,uVar36 >> 0x30);
          local_3d8._0_4_ = FVar54;
          uVar36 = (pSVar32->
                   super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   ).bits;
          sVar11 = (short)(uVar36 >> 0x30);
          if (uVar36 < 0x5000000000000) {
            this_04 = (HaltonSampler *)(uVar36 & 0xffffffffffff);
            if (uVar36 < 0x3000000000000) {
              if (sVar11 == 2) {
                auVar67._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_04);
                auVar67._8_56_ = extraout_var_00;
                auVar45 = auVar67._0_16_;
              }
              else {
                auVar71._0_8_ = HaltonSampler::Get2D(this_04);
                auVar71._8_56_ = extraout_var_04;
                auVar45 = auVar71._0_16_;
              }
            }
            else if (sVar11 == 3) {
              auVar69._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)this_04);
              auVar69._8_56_ = extraout_var_02;
              auVar45 = auVar69._0_16_;
            }
            else {
              auVar73._0_8_ = RandomSampler::Get2D((RandomSampler *)this_04);
              auVar73._8_56_ = extraout_var_06;
              auVar45 = auVar73._0_16_;
            }
          }
          else {
            this_05 = (DebugMLTSampler *)(uVar36 & 0xffffffffffff);
            if (uVar36 < 0x7000000000000) {
              if (sVar11 == 6) {
                auVar68._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)this_05);
                auVar68._8_56_ = extraout_var_01;
                auVar45 = auVar68._0_16_;
              }
              else {
                auVar72._0_8_ = SobolSampler::Get2D((SobolSampler *)this_05);
                auVar72._8_56_ = extraout_var_05;
                auVar45 = auVar72._0_16_;
              }
            }
            else if (sVar11 == 7) {
              auVar70._0_8_ = MLTSampler::Get2D((MLTSampler *)this_05);
              auVar70._8_56_ = extraout_var_03;
              auVar45 = auVar70._0_16_;
            }
            else {
              local_238 = SUB84(this_05,0);
              fStack_234 = (float)((ulong)this_05 >> 0x20);
              local_b8 = DebugMLTSampler::Get1D(this_05);
              uStack_b4 = extraout_XMM0_Db_05;
              uStack_b0 = extraout_XMM0_Dc_05;
              uStack_ac = extraout_XMM0_Dd_05;
              auVar74._0_4_ =
                   DebugMLTSampler::Get1D((DebugMLTSampler *)CONCAT44(fStack_234,local_238));
              auVar74._4_60_ = extraout_var;
              auVar29._4_4_ = uStack_b4;
              auVar29._0_4_ = local_b8;
              auVar29._8_4_ = uStack_b0;
              auVar29._12_4_ = uStack_ac;
              auVar45 = vinsertps_avx(auVar29,auVar74._0_16_,0x10);
            }
          }
          auVar90._0_8_ = local_448._0_8_ ^ 0x8000000080000000;
          auVar90._8_4_ = local_448._8_4_ ^ 0x80000000;
          auVar90._12_4_ = local_448._12_4_ ^ 0x80000000;
          woRender.super_Tuple3<pbrt::Vector3,_float>.z = -local_308._0_4_;
          auVar83._0_8_ = local_308._0_8_ ^ 0x8000000080000000;
          auVar83._8_4_ = local_308._8_4_ ^ 0x80000000;
          auVar83._12_4_ = local_308._12_4_ ^ 0x80000000;
          uVar3 = vmovlps_avx(auVar45);
          local_398._0_4_ = (undefined4)uVar3;
          local_398._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
          sampler = (SamplerHandle *)0x0;
          woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar90._0_8_;
          woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar90._0_8_ >> 0x20);
          local_448 = auVar90;
          local_308 = auVar83;
          pBVar35 = BSDF::Sample_f((BSDFSample *)local_418,(BSDF *)local_2d8,woRender,
                                   (Float)local_3d8._0_4_,(Point2f *)local_398,Radiance,All);
          auVar45 = local_448;
          if (local_3fc <= 0.0) goto LAB_003f0fb8;
          auVar47 = vfmadd132ss_fma(ZEXT416((uint)local_1c8._132_4_),
                                    ZEXT416((uint)((float)local_1c8._136_4_ * local_400)),
                                    ZEXT416((uint)local_408._4_4_));
          auVar55 = vfmsub213ss_fma(ZEXT416((uint)local_400),ZEXT416((uint)local_1c8._136_4_),
                                    ZEXT416((uint)((float)local_1c8._136_4_ * local_400)));
          auVar47 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ + auVar55._0_4_)),
                                    ZEXT416((uint)local_1c8._128_4_),ZEXT416((uint)(float)local_408)
                                   );
          uVar79 = auVar47._0_4_;
          auVar59._4_4_ = uVar79;
          auVar59._0_4_ = uVar79;
          auVar59._8_4_ = uVar79;
          auVar59._12_4_ = uVar79;
          auVar10._8_4_ = 0x7fffffff;
          auVar10._0_8_ = 0x7fffffff7fffffff;
          auVar10._12_4_ = 0x7fffffff;
          auVar47 = vandps_avx512vl(auVar59,auVar10);
          local_238 = auVar47._0_4_ * (float)local_418._0_4_;
          fStack_234 = auVar47._4_4_ * (float)local_418._4_4_;
          fStack_230 = auVar47._8_4_ * (float)local_418._8_4_;
          fStack_22c = auVar47._12_4_ * fStack_40c;
          local_474 = local_3fc;
          local_3d8 = ZEXT416((uint)local_3fc);
          if ((ushort)local_2d8._14_2_ - 3 < 2) {
            wiRender.super_Tuple3<pbrt::Vector3,_float>.z = local_400;
            wiRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_408;
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_308._0_4_;
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_448._0_4_;
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_448._4_4_;
            local_448 = auVar45;
            local_474 = BSDF::PDF((BSDF *)local_2d8,woRender_00,wiRender,Radiance,All);
          }
          auVar62 = local_1c8._0_64_;
          BVar33 = local_3f8 & Specular;
          bVar44 = (local_3f8 & Transmission) == Unset;
          if ((char)local_c8 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
          }
          local_448._0_4_ = local_2d8._0_4_;
          local_218 = (Interval<float>)local_1c8.__align;
          IStack_210.low = (float)local_1c8._8_4_;
          IStack_210.high = (float)local_1c8._12_4_;
          IStack_208.low = (float)local_1c8._16_4_;
          IStack_208.high = (float)local_1c8._20_4_;
          uStack_200 = auVar62._24_4_;
          uStack_1fc = auVar62._28_4_;
          uStack_1f8 = auVar62._32_4_;
          uStack_1f4 = auVar62._36_4_;
          fStack_1f0 = auVar62._40_4_;
          fStack_1ec = auVar62._44_4_;
          fStack_1e8 = auVar62._48_4_;
          uStack_1e4 = auVar62._52_4_;
          uStack_1e0 = auVar62._56_4_;
          uStack_1dc = auVar62._60_4_;
          auVar75._16_48_ = local_1c8._144_48_;
          local_a8._0_8_ = local_1c8._80_8_;
          local_a8._8_8_ = local_1c8._88_8_;
          uStack_98 = local_1c8._96_8_;
          uStack_90 = local_1c8._104_8_;
          uStack_88 = local_1c8._112_8_;
          uStack_80 = local_1c8._120_8_;
          TStack_78._0_8_ = local_1c8._128_8_;
          TStack_78.z = local_1c8._136_4_;
          uStack_6c = local_1c8._140_4_;
          bsdf_00 = (BSDF *)local_2d8;
          local_1c8._0_64_ = auVar62;
          auStack_68 = auVar75._16_48_;
          SurfaceInteraction::SpawnRay
                    ((RayDifferential *)local_398,(SurfaceInteraction *)&local_1c8.__align,ray,
                     bsdf_00,(Vector3f *)&local_408,local_3f8);
          this = local_428;
          auVar60._4_4_ = local_3d8._0_4_;
          auVar60._0_4_ = local_3d8._0_4_;
          auVar60._8_4_ = local_3d8._0_4_;
          auVar60._12_4_ = local_3d8._0_4_;
          auVar28._4_4_ = fStack_234;
          auVar28._0_4_ = local_238;
          auVar28._8_4_ = fStack_230;
          auVar28._12_4_ = fStack_22c;
          auVar45 = vdivps_avx(auVar28,auVar60);
          local_3c8._0_4_ = auVar45._0_4_ * (float)local_3c8._0_4_;
          local_3c8._4_4_ = auVar45._4_4_ * (float)local_3c8._4_4_;
          fStack_3c0 = auVar45._8_4_ * fStack_3c0;
          fStack_3bc = auVar45._12_4_ * fStack_3bc;
          local_478 = BVar33 >> 4;
          local_320 = CONCAT71((int7)(local_320 >> 8),(byte)local_320 | BVar33 == Unset);
          fVar52 = (float)local_1d8._0_4_ * (float)local_448._0_4_ * (float)local_448._0_4_;
          auVar51._16_48_ = auVar75._16_48_;
          auVar51._0_16_ = ZEXT416((uint)fVar52);
          auVar62._4_60_ = auVar51._4_60_;
          auVar62._0_4_ = (float)((uint)bVar44 * local_1d8._0_4_ + (uint)!bVar44 * (int)fVar52);
          local_1d8 = auVar62._0_16_;
          (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_398._12_4_;
          (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_398._16_4_;
          *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
               CONCAT44(local_398._24_4_,local_398._20_4_);
          (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_398._0_4_;
          (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_398._4_4_;
          *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
               CONCAT44(local_398._12_4_,local_398._8_4_);
          (ray->super_Ray).medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = TStack_378.bits;
          *(ulong *)(local_228 + 0x14) = CONCAT44(fStack_358,fStack_35c);
          (((Vector3f *)(local_228 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).x = fStack_354;
          (((Vector3f *)(local_228 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).y = fStack_350;
          *(undefined8 *)(local_228 + 0x24) = uStack_34c;
          *(undefined8 *)(local_228 + 0x2c) = uStack_344;
          *(undefined8 *)local_228 = uStack_370;
          *(undefined8 *)(local_228 + 8) = _fStack_368;
          (((Point3f *)(local_228 + 0x10))->super_Tuple3<pbrt::Point3,_float>).x = fStack_360;
          (((Point3f *)(local_228 + 0x10))->super_Tuple3<pbrt::Point3,_float>).y = fStack_35c;
          *(ulong *)(local_228 + 0x18) = CONCAT44(fStack_354,fStack_358);
          local_398._0_4_ = auVar62._0_4_ * (float)local_3c8._0_4_;
          local_398._4_4_ = auVar62._0_4_ * (float)local_3c8._4_4_;
          local_398._8_4_ = auVar62._0_4_ * fStack_3c0;
          local_398._12_4_ = auVar62._0_4_ * fStack_3bc;
          lVar41 = 1;
          auVar91 = ZEXT464((uint)local_398._0_4_);
          auVar75 = ZEXT464((uint)local_398._0_4_);
          do {
            auVar45 = vmaxss_avx(ZEXT416(*(uint *)(local_398 + lVar41 * 4)),auVar75._0_16_);
            auVar75 = ZEXT1664(auVar45);
            lVar41 = lVar41 + 1;
          } while (lVar41 != 4);
          sampler = (SamplerHandle *)((ulong)bsdf_00 & 0xffffffffffffff00);
          cVar39 = '\0';
          if (0 < iVar31 && auVar45._0_4_ < local_428->rrThreshold) {
            lVar41 = 1;
            do {
              auVar45 = vmaxss_avx(ZEXT416(*(uint *)(local_398 + lVar41 * 4)),auVar91._0_16_);
              auVar91 = ZEXT1664(auVar45);
              lVar41 = lVar41 + 1;
            } while (lVar41 != 4);
            local_448._0_4_ = auVar45._0_4_;
            local_3e8.bits =
                 (local_430->
                 super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
            FVar54 = detail::DispatchSplit<8>::operator()
                               ((DispatchSplit<8> *)&local_3a0,&local_3e8,local_3e8.bits >> 0x30);
            auVar45 = vmaxss_avx(ZEXT416((uint)(1.0 - (float)local_448._0_4_)),ZEXT416(0));
            fVar52 = auVar45._0_4_;
            sampler = (SamplerHandle *)CONCAT71((int7)((ulong)sampler >> 8),FVar54 < fVar52);
            if (fVar52 <= FVar54) {
              fVar52 = 1.0 - fVar52;
              auVar61._4_4_ = fVar52;
              auVar61._0_4_ = fVar52;
              auVar61._8_4_ = fVar52;
              auVar61._12_4_ = fVar52;
              _local_3c8 = vdivps_avx(_local_3c8,auVar61);
              cVar39 = '\0';
            }
            else {
              cVar39 = (FVar54 < fVar52) * '\x03';
            }
          }
          auVar45 = local_3d8;
          local_3d8._1_3_ = 0;
          local_3d8[0] = cVar39 == '\x03';
          local_3d8._4_12_ = auVar45._4_12_;
        }
        iVar31 = local_458._0_4_;
      }
    }
    if ((char)local_c8 == '\x01') {
      local_c8 = local_c8 & 0xffffffffffffff00;
    }
    if (local_3d8[0] != '\0') {
      lVar41 = (long)iVar31;
      *(long *)(in_FS_OFFSET + -0x2a8) = *(long *)(in_FS_OFFSET + -0x2a8) + lVar41;
      *(long *)(in_FS_OFFSET + -0x2a0) = *(long *)(in_FS_OFFSET + -0x2a0) + 1;
      lVar37 = *(long *)(in_FS_OFFSET + -0x720);
      if (lVar41 <= *(long *)(in_FS_OFFSET + -0x720)) {
        lVar37 = lVar41;
      }
      *(long *)(in_FS_OFFSET + -0x720) = lVar37;
      if (lVar41 < *(long *)(in_FS_OFFSET + -0x718)) {
        lVar41 = *(long *)(in_FS_OFFSET + -0x718);
      }
      *(long *)(in_FS_OFFSET + -0x718) = lVar41;
      auVar45 = vshufpd_avx(_local_3b8,_local_3b8,1);
      SVar92.values.values._0_8_ = local_3b8;
      SVar92.values.values._8_8_ = auVar45._0_8_;
      return (SampledSpectrum)SVar92.values.values;
    }
  } while( true );
}

Assistant:

SampledSpectrum PathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                   SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                   VisibleSurface *visibleSurface) const {
    SampledSpectrum L(0.f), beta(1.f);
    bool specularBounce = false, anyNonSpecularBounces = false;
    int depth = 0;
    Float etaScale = 1, bsdfPDF;
    SurfaceInteraction prevIntr;

    while (true) {
        // Find next path vertex and accumulate contribution
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        // Add emitted light at path vertex or from the environment
        if (!si) {
            // Incorporate emission from infinite lights for escaped ray
            for (const auto &light : infiniteLights) {
                SampledSpectrum Le = light.Le(ray, lambda);
                if (depth == 0 || specularBounce)
                    L += SafeDiv(beta * Le, lambda.PDF());
                else {
                    // Compute MIS weight for infinite light
                    Float lightPDF =
                        lightSampler.PDF(prevIntr, light) *
                        light.PDF_Li(prevIntr, ray.d, LightSamplingMode::WithMIS);
                    Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);

                    L += SafeDiv(beta * weight * Le, lambda.PDF());
                }
            }

            break;
        }
        // Incorporate emission from emissive surface hit by ray
        SampledSpectrum Le = si->intr.Le(-ray.d, lambda);
        if (Le) {
            if (depth == 0 || specularBounce)
                L += SafeDiv(beta * Le, lambda.PDF());
            else {
                // Compute MIS weight for area light
                LightHandle areaLight(si->intr.areaLight);
                Float lightPDF =
                    lightSampler.PDF(prevIntr, areaLight) *
                    areaLight.PDF_Li(prevIntr, ray.d, LightSamplingMode::WithMIS);
                Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);

                L += SafeDiv(beta * weight * Le, lambda.PDF());
            }
        }

        SurfaceInteraction &isect = si->intr;

        // Compute scattering functions and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Initialize _visibleSurface_ at first intersection
        if (depth == 0 && visibleSurface != nullptr) {
            // Estimate BSDF's albedo
            constexpr int nRhoSamples = 16;
            SampledSpectrum rho(0.f);
            for (int i = 0; i < nRhoSamples; ++i) {
                // Generate sample for hemispherical-directional reflectance
                Float uc = RadicalInverse(0, i + 1);
                Point2f u(RadicalInverse(1, i + 1), RadicalInverse(2, i + 1));

                // Estimate one term of $\rho_\roman{hd}$
                auto bs = bsdf.Sample_f(si->intr.wo, uc, u);
                if (bs && bs.pdf > 0)
                    rho += bs.f * AbsDot(bs.wi, si->intr.shading.n) / bs.pdf;
            }
            SampledSpectrum albedo = rho / nRhoSamples;

            *visibleSurface =
                VisibleSurface(si->intr, camera.GetCameraTransform(), albedo, lambda);
        }

        // End path if maximum depth reached
        if (depth++ == maxDepth)
            break;

        // Possibly regularize the BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }

        ++totalBSDFs;
        // Sample direct illumination from the light sources
        if (bsdf.IsNonSpecular()) {
            ++totalPaths;
            SampledSpectrum Ld = SampleLd(isect, bsdf, lambda, sampler);
            if (!Ld)
                ++zeroRadiancePaths;
            L += SafeDiv(beta * Ld, lambda.PDF());
        }

        // Sample BSDF to get new path direction
        Vector3f wo = -ray.d;
        Float u = sampler.Get1D();
        BSDFSample bs = bsdf.Sample_f(wo, u, sampler.Get2D());
        if (!bs)
            break;
        // Update path state variables for after surface scattering
        beta *= bs.f * AbsDot(bs.wi, isect.shading.n) / bs.pdf;
        bsdfPDF = bsdf.SampledPDFIsProportional() ? bsdf.PDF(wo, bs.wi) : bs.pdf;
        DCHECK(!IsInf(beta.y(lambda)));
        specularBounce = bs.IsSpecular();
        anyNonSpecularBounces |= !bs.IsSpecular();
        if (bs.IsTransmission())
            etaScale *= Sqr(bsdf.eta);
        prevIntr = si->intr;

        ray = isect.SpawnRay(ray, bsdf, bs.wi, bs.flags);

        // Possibly terminate the path with Russian roulette
        SampledSpectrum rrBeta = beta * etaScale;
        if (rrBeta.MaxComponentValue() < rrThreshold && depth > 1) {
            Float q = std::max<Float>(0, 1 - rrBeta.MaxComponentValue());
            if (sampler.Get1D() < q)
                break;
            beta /= 1 - q;
            DCHECK(!IsInf(beta.y(lambda)));
        }
    }
    ReportValue(pathLength, depth);
    return L;
}